

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *target,string *lib,LinkLibraryType llt)

{
  __type _Var1;
  cmTarget *pcVar2;
  size_type sVar3;
  char *pcVar4;
  allocator local_9d;
  LinkLibraryType local_9c;
  string dependencies;
  string libName;
  LibraryID tmp;
  
  pcVar2 = cmMakefile::FindTargetToUse(this->Makefile,lib,false);
  if (((pcVar2 == (cmTarget *)0x0) || (llt == GENERAL)) || (pcVar2->IsImportedTarget != false)) {
    std::__cxx11::string::string((string *)&libName,(string *)lib);
  }
  else {
    local_9c = llt;
    std::operator+(&tmp.first,"$<TARGET_NAME:",lib);
    std::operator+(&libName,&tmp.first,">");
    std::__cxx11::string::~string((string *)&tmp);
    llt = local_9c;
  }
  std::__cxx11::string::string((string *)&tmp,"LINK_LIBRARIES",&local_9d);
  GetDebugGeneratorExpressions(&dependencies,this,&libName,llt);
  AppendProperty(this,&tmp.first,dependencies._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&dependencies);
  std::__cxx11::string::~string((string *)&tmp);
  std::__cxx11::string::~string((string *)&libName);
  sVar3 = cmGeneratorExpression::Find(lib);
  if ((sVar3 == 0xffffffffffffffff) &&
     ((pcVar2 == (cmTarget *)0x0 || (pcVar2->TargetTypeValue != INTERFACE_LIBRARY)))) {
    _Var1 = std::operator==(target,lib);
    if (!_Var1) {
      tmp.first._M_dataplus._M_p = (pointer)&tmp.first.field_2;
      tmp.first._M_string_length = 0;
      tmp.first.field_2._M_local_buf[0] = '\0';
      tmp.second = GENERAL;
      std::__cxx11::string::_M_assign((string *)&tmp);
      tmp.second = llt;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
      ::push_back(&this->OriginalLinkLibraries,&tmp);
      ClearLinkMaps(this);
      if (this->RecordDependencies == true) {
        std::__cxx11::string::string((string *)&libName,(string *)target);
        std::__cxx11::string::append((char *)&libName);
        dependencies._M_dataplus._M_p = (pointer)&dependencies.field_2;
        dependencies._M_string_length = 0;
        dependencies.field_2._M_local_buf[0] = '\0';
        pcVar4 = cmMakefile::GetDefinition(mf,&libName);
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::append((char *)&dependencies);
        }
        if (llt < (OPTIMIZED|DEBUG)) {
          std::__cxx11::string::append((char *)&dependencies);
        }
        std::__cxx11::string::append((char *)&dependencies);
        std::__cxx11::string::append((string *)&dependencies);
        std::__cxx11::string::append((char *)&dependencies);
        cmMakefile::AddCacheDefinition
                  (mf,&libName,dependencies._M_dataplus._M_p,"Dependencies for the target",STATIC,
                   false);
        std::__cxx11::string::~string((string *)&dependencies);
        std::__cxx11::string::~string((string *)&libName);
      }
      std::__cxx11::string::~string((string *)&tmp);
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf,
                              const std::string& target,
                              const std::string& lib,
                              LinkLibraryType llt)
{
  cmTarget *tgt = this->Makefile->FindTargetToUse(lib);
  {
  const bool isNonImportedTarget = tgt && !tgt->IsImported();

  const std::string libName = (isNonImportedTarget && llt != GENERAL)
                                                        ? targetNameGenex(lib)
                                                        : lib;
  this->AppendProperty("LINK_LIBRARIES",
                       this->GetDebugGeneratorExpressions(libName,
                                                          llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos
      || (tgt && tgt->GetType() == INTERFACE_LIBRARY)
      || (target == lib ))
    {
    return;
    }

  cmTarget::LibraryID tmp;
  tmp.first = lib;
  tmp.second = llt;
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LinkLibrariesForVS6.push_back( tmp );
#endif
  this->OriginalLinkLibraries.push_back(tmp);
  this->ClearLinkMaps();

  // Add the explicit dependency information for this target. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if(this->RecordDependencies)
    {
    std::string targetEntry = target;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition( targetEntry );
    if( old_val )
      {
      dependencies += old_val;
      }
    switch (llt)
      {
      case cmTarget::GENERAL:
        dependencies += "general";
        break;
      case cmTarget::DEBUG:
        dependencies += "debug";
        break;
      case cmTarget::OPTIMIZED:
        dependencies += "optimized";
        break;
      }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition( targetEntry, dependencies.c_str(),
                           "Dependencies for the target",
                           cmState::STATIC );
    }

}